

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O2

void MOJOSHADER_freeEffect(MOJOSHADER_effect *_effect)

{
  uint uVar1;
  MOJOSHADER_free UNRECOVERED_JUMPTABLE;
  void *d;
  MOJOSHADER_effectTechnique *pMVar2;
  MOJOSHADER_effectPass *pMVar3;
  MOJOSHADER_effectObject *pMVar4;
  MOJOSHADER_parseData *_data;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  MOJOSHADER_effect *effect;
  long lVar8;
  long lVar9;
  MOJOSHADER_effectParam *value;
  
  if (_effect == &MOJOSHADER_out_of_mem_effect || _effect == (MOJOSHADER_effect *)0x0) {
    return;
  }
  UNRECOVERED_JUMPTABLE = _effect->free;
  d = _effect->malloc_data;
  lVar9 = 0;
  for (lVar8 = 0; lVar8 < _effect->error_count; lVar8 = lVar8 + 1) {
    (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_effect->errors->error + lVar9),d);
    (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_effect->errors->filename + lVar9),d);
    lVar9 = lVar9 + 0x18;
  }
  (*UNRECOVERED_JUMPTABLE)(_effect->errors,d);
  (*UNRECOVERED_JUMPTABLE)(_effect->profile,d);
  for (lVar8 = 0; lVar8 < _effect->param_count; lVar8 = lVar8 + 1) {
    value = _effect->params + lVar8;
    freevalue(&value->value,UNRECOVERED_JUMPTABLE,d);
    lVar9 = 0;
    for (uVar6 = 0; uVar6 < value->annotation_count; uVar6 = uVar6 + 1) {
      freevalue((MOJOSHADER_effectValue *)((long)&value->annotations->name + lVar9),
                UNRECOVERED_JUMPTABLE,d);
      lVar9 = lVar9 + 0x40;
    }
    (*UNRECOVERED_JUMPTABLE)(value->annotations,d);
  }
  (*UNRECOVERED_JUMPTABLE)(_effect->params,d);
  for (lVar8 = 0; pMVar2 = _effect->techniques, lVar8 < _effect->technique_count; lVar8 = lVar8 + 1)
  {
    (*UNRECOVERED_JUMPTABLE)(pMVar2[lVar8].name,d);
    for (uVar6 = 0; pMVar3 = pMVar2[lVar8].passes, uVar6 < pMVar2[lVar8].pass_count;
        uVar6 = uVar6 + 1) {
      (*UNRECOVERED_JUMPTABLE)(pMVar3[uVar6].name,d);
      lVar9 = 8;
      for (uVar7 = 0; uVar7 < pMVar3[uVar6].state_count; uVar7 = uVar7 + 1) {
        freevalue((MOJOSHADER_effectValue *)((long)&(pMVar3[uVar6].states)->type + lVar9),
                  UNRECOVERED_JUMPTABLE,d);
        lVar9 = lVar9 + 0x48;
      }
      (*UNRECOVERED_JUMPTABLE)(pMVar3[uVar6].states,d);
      lVar9 = 0;
      for (uVar7 = 0; uVar7 < pMVar3[uVar6].annotation_count; uVar7 = uVar7 + 1) {
        freevalue((MOJOSHADER_effectValue *)((long)&(pMVar3[uVar6].annotations)->name + lVar9),
                  UNRECOVERED_JUMPTABLE,d);
        lVar9 = lVar9 + 0x40;
      }
      (*UNRECOVERED_JUMPTABLE)(pMVar3[uVar6].annotations,d);
    }
    (*UNRECOVERED_JUMPTABLE)(pMVar3,d);
    lVar9 = 0;
    for (uVar6 = 0; uVar6 < pMVar2[lVar8].annotation_count; uVar6 = uVar6 + 1) {
      freevalue((MOJOSHADER_effectValue *)((long)&(pMVar2[lVar8].annotations)->name + lVar9),
                UNRECOVERED_JUMPTABLE,d);
      lVar9 = lVar9 + 0x40;
    }
    (*UNRECOVERED_JUMPTABLE)(pMVar2[lVar8].annotations,d);
  }
  (*UNRECOVERED_JUMPTABLE)(pMVar2,d);
  lVar8 = 0;
  lVar9 = 0;
  do {
    pMVar4 = _effect->objects;
    if (_effect->object_count <= lVar9) {
      (*UNRECOVERED_JUMPTABLE)(pMVar4,d);
      (*UNRECOVERED_JUMPTABLE)(_effect,d);
      return;
    }
    uVar1 = *(uint *)((long)pMVar4 + lVar8);
    if (uVar1 < 0x11) {
      lVar5 = 8;
      if ((0x7c10U >> (uVar1 & 0x1f) & 1) == 0) {
        if ((0x18000U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_0011dfca;
        _data = *(MOJOSHADER_parseData **)((long)pMVar4 + lVar8 + 0x40);
        if (*(int *)((long)pMVar4 + lVar8 + 0xc) == 0) {
          MOJOSHADER_freeParseData(_data);
        }
        else {
          MOJOSHADER_freePreshader((MOJOSHADER_preshader *)_data);
        }
        (*UNRECOVERED_JUMPTABLE)(*(void **)((long)pMVar4 + lVar8 + 0x28),d);
        (*UNRECOVERED_JUMPTABLE)(*(void **)((long)pMVar4 + lVar8 + 0x38),d);
        lVar5 = 0x18;
      }
      (*UNRECOVERED_JUMPTABLE)(*(void **)((long)pMVar4 + lVar8 + lVar5),d);
    }
LAB_0011dfca:
    lVar9 = lVar9 + 1;
    lVar8 = lVar8 + 0x48;
  } while( true );
}

Assistant:

void MOJOSHADER_freeEffect(const MOJOSHADER_effect *_effect)
{
    MOJOSHADER_effect *effect = (MOJOSHADER_effect *) _effect;
    if ((effect == NULL) || (effect == &MOJOSHADER_out_of_mem_effect))
        return;  // no-op.

    MOJOSHADER_free f = effect->free;
    void *d = effect->malloc_data;
    int i, j, k;

    /* Free errors */
    for (i = 0; i < effect->error_count; i++)
    {
        f((void *) effect->errors[i].error, d);
        f((void *) effect->errors[i].filename, d);
    } // for
    f((void *) effect->errors, d);

    /* Free profile string */
    f((void *) effect->profile, d);

    /* Free parameters, including annotations */
    for (i = 0; i < effect->param_count; i++)
    {
        MOJOSHADER_effectParam *param = &effect->params[i];
        freevalue(&param->value, f, d);
        for (j = 0; j < param->annotation_count; j++)
        {
            freevalue(&param->annotations[j], f, d);
        } // for
        f((void *) param->annotations, d);
    } // for
    f((void *) effect->params, d);

    /* Free techniques, including passes and all annotations */
    for (i = 0; i < effect->technique_count; i++)
    {
        MOJOSHADER_effectTechnique *technique = &effect->techniques[i];
        f((void *) technique->name, d);
        for (j = 0; j < technique->pass_count; j++)
        {
            MOJOSHADER_effectPass *pass = &technique->passes[j];
            f((void *) pass->name, d);
            for (k = 0; k < pass->state_count; k++)
            {
                freevalue(&pass->states[k].value, f, d);
            } // for
            f((void *) pass->states, d);
            for (k = 0; k < pass->annotation_count; k++)
            {
                freevalue(&pass->annotations[k], f, d);
            } // for
            f((void *) pass->annotations, d);
        } // for
        f((void *) technique->passes, d);
        for (j = 0; j < technique->annotation_count; j++)
        {
            freevalue(&technique->annotations[j], f, d);
        } // for
        f((void *) technique->annotations, d);
    } // for
    f((void *) effect->techniques, d);

    /* Free object table */
    for (i = 0; i < effect->object_count; i++)
    {
        MOJOSHADER_effectObject *object = &effect->objects[i];
        if (object->type == MOJOSHADER_SYMTYPE_PIXELSHADER
         || object->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            if (object->shader.is_preshader)
                MOJOSHADER_freePreshader(object->shader.preshader);
            else
                MOJOSHADER_freeParseData(object->shader.shader);
            f((void *) object->shader.params, d);
            f((void *) object->shader.samplers, d);
            f((void *) object->shader.preshader_params, d);
        } // if
        else if (object->type == MOJOSHADER_SYMTYPE_SAMPLER
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER1D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER2D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER3D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
            f((void *) object->mapping.name, d);
        else if (object->type == MOJOSHADER_SYMTYPE_STRING)
            f((void *) object->string.string, d);
    } // for
    f((void *) effect->objects, d);

    /* Free base effect structure */
    f((void *) effect, d);
}